

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

CoinsList * __thiscall wallet::anon_unknown_5::WalletImpl::listCoins(WalletImpl *this)

{
  long lVar1;
  bool bVar2;
  WalletTxOut *this_00;
  reference pCVar3;
  COutput *in_RSI;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  COutput *coin;
  vector<wallet::COutput,_std::allocator<wallet::COutput>_> *__range3;
  mapped_type *group;
  pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
  *entry;
  map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  *__range2;
  CoinsList *result;
  const_iterator __end3;
  const_iterator __begin3;
  iterator __end2;
  iterator __begin2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock29;
  WalletTxOut *in_stack_fffffffffffffec8;
  map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  *in_stack_fffffffffffffed0;
  WalletTxOut *in_stack_fffffffffffffed8;
  COutPoint *__args;
  WalletTxOut *in_stack_fffffffffffffee8;
  CWallet *wallet;
  optional<long> *this_01;
  CWallet *in_stack_ffffffffffffff60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = &in_RSI->fee;
  wallet = in_RDI;
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffec8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffec8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_01,
             (AnnotatedMixin<std::recursive_mutex> *)wallet,(char *)in_RSI,(char *)in_RDI,
             (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffee8 >> 0x18,0));
  _GLOBAL__N_1::std::
  map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<std::tuple<COutPoint,_interfaces::WalletTxOut>,_std::allocator<std::tuple<COutPoint,_interfaces::WalletTxOut>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<std::tuple<COutPoint,_interfaces::WalletTxOut>,_std::allocator<std::tuple<COutPoint,_interfaces::WalletTxOut>_>_>_>_>_>
  ::map((map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<std::tuple<COutPoint,_interfaces::WalletTxOut>,_std::allocator<std::tuple<COutPoint,_interfaces::WalletTxOut>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<std::tuple<COutPoint,_interfaces::WalletTxOut>,_std::allocator<std::tuple<COutPoint,_interfaces::WalletTxOut>_>_>_>_>_>
         *)in_stack_fffffffffffffec8);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffed8);
  ListCoins(in_stack_ffffffffffffff60);
  _GLOBAL__N_1::std::
  map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::begin(in_stack_fffffffffffffed0);
  _GLOBAL__N_1::std::
  map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::end(in_stack_fffffffffffffed0);
  while (bVar2 = _GLOBAL__N_1::std::operator==
                           ((_Self *)in_stack_fffffffffffffed8,(_Self *)in_stack_fffffffffffffed0),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    _GLOBAL__N_1::std::
    _Rb_tree_iterator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>
                 *)in_stack_fffffffffffffec8);
    this_00 = (WalletTxOut *)
              _GLOBAL__N_1::std::
              map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<std::tuple<COutPoint,_interfaces::WalletTxOut>,_std::allocator<std::tuple<COutPoint,_interfaces::WalletTxOut>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<std::tuple<COutPoint,_interfaces::WalletTxOut>,_std::allocator<std::tuple<COutPoint,_interfaces::WalletTxOut>_>_>_>_>_>
              ::operator[]((map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<std::tuple<COutPoint,_interfaces::WalletTxOut>,_std::allocator<std::tuple<COutPoint,_interfaces::WalletTxOut>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<std::tuple<COutPoint,_interfaces::WalletTxOut>,_std::allocator<std::tuple<COutPoint,_interfaces::WalletTxOut>_>_>_>_>_>
                            *)in_RDI,(key_type *)in_stack_fffffffffffffee8);
    in_stack_fffffffffffffee8 = this_00;
    _GLOBAL__N_1::std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::begin
              ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
               in_stack_fffffffffffffed0);
    _GLOBAL__N_1::std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::end
              ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
               in_stack_fffffffffffffed0);
    while (bVar2 = __gnu_cxx::
                   operator==<const_wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
                             ((__normal_iterator<const_wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
                               *)in_stack_fffffffffffffed8,
                              (__normal_iterator<const_wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
                               *)in_stack_fffffffffffffed0), ((bVar2 ^ 0xffU) & 1) != 0) {
      pCVar3 = __gnu_cxx::
               __normal_iterator<const_wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
               ::operator*((__normal_iterator<const_wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
                            *)in_stack_fffffffffffffec8);
      __args = &pCVar3->outpoint;
      in_stack_fffffffffffffed8 = this_00;
      std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 this_00);
      MakeWalletTxOut(wallet,in_RSI);
      std::
      vector<std::tuple<COutPoint,interfaces::WalletTxOut>,std::allocator<std::tuple<COutPoint,interfaces::WalletTxOut>>>
      ::emplace_back<COutPoint_const&,interfaces::WalletTxOut>
                ((vector<std::tuple<COutPoint,_interfaces::WalletTxOut>,_std::allocator<std::tuple<COutPoint,_interfaces::WalletTxOut>_>_>
                  *)in_stack_fffffffffffffee8,__args,in_stack_fffffffffffffed8);
      interfaces::WalletTxOut::~WalletTxOut(in_stack_fffffffffffffec8);
      __gnu_cxx::
      __normal_iterator<const_wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
      ::operator++((__normal_iterator<const_wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
                    *)in_stack_fffffffffffffec8);
    }
    _GLOBAL__N_1::std::
    _Rb_tree_iterator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>
                  *)in_stack_fffffffffffffec8);
  }
  _GLOBAL__N_1::std::
  map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~map((map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
          *)in_stack_fffffffffffffec8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffec8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (CoinsList *)in_RDI;
}

Assistant:

CoinsList listCoins() override
    {
        LOCK(m_wallet->cs_wallet);
        CoinsList result;
        for (const auto& entry : ListCoins(*m_wallet)) {
            auto& group = result[entry.first];
            for (const auto& coin : entry.second) {
                group.emplace_back(coin.outpoint,
                    MakeWalletTxOut(*m_wallet, coin));
            }
        }
        return result;
    }